

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semantics.c
# Opt level: O0

void SEM_CompSt(ast *node,field_t *f)

{
  attr *paVar1;
  long in_RSI;
  ast *in_RDI;
  attr *a;
  attr *in_stack_00000038;
  char *in_stack_00000040;
  long local_10;
  
  newenv();
  for (local_10 = in_RSI; local_10 != 0; local_10 = *(long *)(local_10 + 0x18)) {
    if (**(int **)(local_10 + 8) == 2) {
      paVar1 = findvar(in_stack_00000040);
      if (paVar1 == (attr *)0x0) {
        semerror(0x11,(int)(ulong)(uint)in_RDI->pos->first_line,semErrorMsg[0x11],
                 *puRam0000000000000008);
      }
      else {
        insertvar(in_stack_00000040,in_stack_00000038);
      }
    }
    else {
      insertvar(in_stack_00000040,in_stack_00000038);
    }
  }
  child(in_RDI,2);
  SEM_DefList((ast *)f,a._4_4_);
  child(in_RDI,3);
  SEM_StmtList((ast *)0x10a47e);
  deleteenv();
  return;
}

Assistant:

static void SEM_CompSt(struct ast *node, struct field_t *f) {
#if COMPILER_VERSION < 3
    newenv();
#endif
    for (; f; f = f->next) {
        struct attr *a = f->type;
        if (a->kind == STRUCTURE) {
            a = findvar(a->structure->name);
            if (a == NULL) {
                SEMERROR(UndefinedStruct, node, a->structure->name);
            } else
                insertvar(f->name, a);
        } else
            insertvar(f->name, f->type);
    }
    SEM_DefList(child(node, 2), 1);
    SEM_StmtList(child(node ,3));
#if COMPILER_VERSION < 3
    deleteenv();
#endif
}